

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O2

void ARGB1555ToARGBRow_C(uint8_t *src_argb1555,uint8_t *dst_argb,int width)

{
  byte bVar1;
  byte bVar2;
  ulong uVar3;
  ulong uVar4;
  byte bVar5;
  
  uVar3 = 0;
  uVar4 = (ulong)(uint)width;
  if (width < 1) {
    uVar4 = uVar3;
  }
  for (; (int)uVar4 != (int)uVar3; uVar3 = uVar3 + 1) {
    bVar1 = src_argb1555[uVar3 * 2];
    bVar2 = src_argb1555[uVar3 * 2 + 1];
    bVar5 = bVar2 * '\b' | bVar1 >> 5;
    dst_argb[uVar3 * 4] = bVar1 >> 2 & 7 | bVar1 * '\b';
    dst_argb[uVar3 * 4 + 1] = (bVar5 & 0x1c) >> 2 | bVar5 << 3;
    dst_argb[uVar3 * 4 + 2] = bVar2 >> 4 & 7 | bVar2 * '\x02' & 0xf8;
    dst_argb[uVar3 * 4 + 3] = (char)bVar2 >> 7;
  }
  return;
}

Assistant:

void ARGB1555ToARGBRow_C(const uint8_t* src_argb1555,
                         uint8_t* dst_argb,
                         int width) {
  int x;
  for (x = 0; x < width; ++x) {
    uint8_t b = src_argb1555[0] & 0x1f;
    uint8_t g = (src_argb1555[0] >> 5) | ((src_argb1555[1] & 0x03) << 3);
    uint8_t r = (src_argb1555[1] & 0x7c) >> 2;
    uint8_t a = src_argb1555[1] >> 7;
    dst_argb[0] = (b << 3) | (b >> 2);
    dst_argb[1] = (g << 3) | (g >> 2);
    dst_argb[2] = (r << 3) | (r >> 2);
    dst_argb[3] = -a;
    dst_argb += 4;
    src_argb1555 += 2;
  }
}